

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkFFT.c
# Opt level: O1

complex line_to_number(char *line)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  undefined8 extraout_RAX;
  undefined4 extraout_var;
  undefined8 extraout_RAX_00;
  uint extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  ulong uVar5;
  regex_t *__endptr;
  regex_t *in_RDI;
  regex_t *prVar7;
  ulong uVar8;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  complex auVar9;
  complex auVar10;
  complex auVar11;
  regex_t *local_18;
  undefined7 uVar6;
  
  prVar7 = &preg;
  __endptr = in_RDI;
  local_18 = in_RDI;
  iVar3 = regexec((regex_t *)&preg,(char *)in_RDI,0,(regmatch_t *)0x0,0);
  if (iVar3 == 1) {
    line_to_number_cold_3();
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = 0;
    __endptr = (regex_t *)&stack0xffffffffffffffe8;
    strtof((char *)in_RDI,(char **)__endptr);
    prVar7 = in_RDI;
    if (*piVar4 == 0) {
      __endptr = (regex_t *)&stack0xffffffffffffffe8;
      strtof((char *)local_18,(char **)__endptr);
      prVar7 = local_18;
      if (*piVar4 == 0) {
        auVar9._8_8_ = extraout_RDX;
        auVar9._0_8_ = extraout_RAX;
        return auVar9;
      }
      goto LAB_00101d41;
    }
  }
  line_to_number_cold_1();
LAB_00101d41:
  line_to_number_cold_2();
  uVar8 = 0;
  do {
    if (((ulong)__endptr & 0xffffffff) == uVar8) {
      iVar3 = dup2(*(int *)((long)&prVar7->__buffer + uVar8 * 8 + 4),1);
      if (iVar3 == -1) {
        dup_needed_pipes_cold_2();
LAB_00101db7:
        dup_needed_pipes_cold_1();
        bVar1 = NAN(extraout_XMM0_Qa * in_XMM2_Qa - in_XMM1_Qa * in_XMM3_Qa);
        bVar2 = NAN(extraout_XMM0_Qa * in_XMM3_Qa + in_XMM2_Qa * in_XMM1_Qa);
        uVar6 = (undefined7)((ulong)extraout_RDX_01 >> 8);
        uVar5 = CONCAT71(uVar6,bVar2);
        uVar8 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),bVar1 && bVar2);
        if (bVar1 && bVar2) {
          if ((1.79769313486232e+308 < ABS(extraout_XMM0_Qa)) ||
             (1.79769313486232e+308 < ABS(in_XMM1_Qa))) {
            uVar6 = 0;
            if (NAN(in_XMM2_Qa)) {
              in_XMM2_Qa = (double)((ulong)in_XMM2_Qa & 0x8000000000000000);
            }
            if (NAN(in_XMM3_Qa)) {
              in_XMM3_Qa = (double)((ulong)in_XMM3_Qa & 0x8000000000000000);
            }
          }
          else {
            uVar8 = 0;
          }
          in_XMM2_Qa = ABS(in_XMM2_Qa);
          uVar5 = CONCAT71(uVar6,1.79769313486232e+308 < in_XMM2_Qa);
          if ((1.79769313486232e+308 < in_XMM2_Qa) || (1.79769313486232e+308 < ABS(in_XMM3_Qa))) {
            uVar5 = (ulong)(1.79769313486232e+308 < in_XMM2_Qa);
            uVar8 = (ulong)(1.79769313486232e+308 < ABS(in_XMM3_Qa));
          }
        }
        auVar11._8_8_ = uVar5;
        auVar11._0_8_ = uVar8;
        return auVar11;
      }
    }
    else if ((extraout_EDX == uVar8) &&
            (iVar3 = dup2(*(int *)(&prVar7->__buffer + uVar8),0), iVar3 == -1)) goto LAB_00101db7;
    close(*(int *)((long)&prVar7->__buffer + uVar8 * 8 + 4));
    auVar10._0_4_ = close(*(int *)(&prVar7->__buffer + uVar8));
    auVar10._4_4_ = extraout_var;
    uVar8 = uVar8 + 1;
    if (uVar8 == 4) {
      auVar10._8_8_ = extraout_RDX_00;
      return auVar10;
    }
  } while( true );
}

Assistant:

static double complex line_to_number(char* line){
    double complex ret = 0;

    check_for_number(line);

    errno = 0;
    ret = strtof(line, &line);
    if (!(*line != '\n' || *line != ' ') || errno != 0)
    {
        ERROR_EXIT("invalid number");
    }
    ret += strtof(line, &line) * I;

    if (!(*line != '\n' || *line != ' ') || errno != 0)
    {
        ERROR_EXIT("invalid number");
    }

    return ret;
}